

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupContextVoid(char *str_id,int mouse_button)

{
  bool bVar1;
  char *pcStack_10;
  int mouse_button_local;
  char *str_id_local;
  
  pcStack_10 = str_id;
  if (str_id == (char *)0x0) {
    pcStack_10 = "void_context_menu";
  }
  bVar1 = IsMouseHoveringAnyWindow();
  if ((!bVar1) && (bVar1 = IsMouseClicked(mouse_button,false), bVar1)) {
    OpenPopupEx(pcStack_10,true);
  }
  bVar1 = BeginPopup(pcStack_10);
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextVoid(const char* str_id, int mouse_button)
{
    if (!str_id) str_id = "void_context_menu";
    if (!IsMouseHoveringAnyWindow() && IsMouseClicked(mouse_button))
        OpenPopupEx(str_id, true);
    return BeginPopup(str_id);
}